

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ugen.c
# Opt level: O1

void ugen_done_graph(_dspcontext *dc)

{
  int downsample;
  int upsample;
  int iVar1;
  _dspcontext *p_Var2;
  _vinlet *x;
  t_pd p_Var3;
  _sigoutconnect *p_Var4;
  t_object *ptVar5;
  char *pcVar6;
  t_signal *sig2;
  t_signal **parentsigs;
  _ugenbox *p_Var7;
  t_signal *ptVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  _siginlet *p_Var12;
  t_ugenbox *ptVar13;
  int *piVar14;
  t_signal **pptVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  t_object *object;
  _sigoutlet *p_Var20;
  long lVar21;
  long lVar22;
  t_sigoutconnect *ptVar23;
  float fVar24;
  int local_6c;
  int local_68;
  float local_60;
  int local_48;
  int local_40;
  
  p_Var2 = dc->dc_parentcontext;
  if (*(int *)(pd_maininstance.pd_ugen + 0x134) != 0) {
    post("ugen_done_graph...");
    for (p_Var7 = dc->dc_ugenlist; p_Var7 != (_ugenbox *)0x0; p_Var7 = p_Var7->u_next) {
      class_getname((p_Var7->u_obj->te_g).g_pd);
      post("ugen: %s");
      if (0 < p_Var7->u_nout) {
        p_Var20 = p_Var7->u_out;
        uVar11 = 0;
        do {
          for (ptVar23 = p_Var20->o_connections; ptVar23 != (t_sigoutconnect *)0x0;
              ptVar23 = ptVar23->oc_next) {
            pcVar6 = class_getname((ptVar23->oc_who->u_obj->te_g).g_pd);
            ptVar13 = dc->dc_ugenlist;
            uVar10 = 0xffffffff;
            if (ptVar13 != (t_ugenbox *)0x0) {
              uVar18 = 0;
              do {
                if (ptVar13 == ptVar23->oc_who) {
                  uVar10 = (ulong)uVar18;
                  break;
                }
                uVar18 = uVar18 + 1;
                ptVar13 = ptVar13->u_next;
              } while (ptVar13 != (_ugenbox *)0x0);
            }
            post("... out %d to %s, index %d, inlet %d",uVar11,pcVar6,uVar10,
                 (ulong)(uint)ptVar23->oc_inno);
          }
          p_Var20 = p_Var20 + 1;
          uVar18 = (int)uVar11 + 1;
          uVar11 = (ulong)uVar18;
        } while ((int)uVar18 < p_Var7->u_nout);
      }
    }
  }
  p_Var7 = dc->dc_ugenlist;
  if (p_Var7 == (_ugenbox *)0x0) {
    object = (t_object *)0x0;
  }
  else {
    object = (t_object *)0x0;
    do {
      ptVar5 = object;
      if (((p_Var7->u_obj->te_g).g_pd == block_class) &&
         (ptVar5 = p_Var7->u_obj, object != (t_object *)0x0)) {
        pd_error(object,"conflicting block~ and/or switch~ objects in same window");
        ptVar5 = object;
      }
      object = ptVar5;
      p_Var7 = p_Var7->u_next;
    } while (p_Var7 != (_ugenbox *)0x0);
  }
  if (p_Var2 == (_dspcontext *)0x0) {
    local_60 = sys_getsr();
    iVar17 = sys_getblksize();
  }
  else {
    local_60 = p_Var2->dc_srate;
    iVar17 = p_Var2->dc_vecsize;
  }
  if (object == (t_object *)0x0) {
    local_6c = iVar17;
    if (p_Var2 != (_dspcontext *)0x0) {
      local_6c = p_Var2->dc_calcsize;
    }
    uVar10 = (ulong)(p_Var2 == (_dspcontext *)0x0);
    uVar11 = 0;
    local_40 = 1;
    local_48 = 1;
    downsample = 1;
    upsample = 1;
    fVar24 = local_60;
    iVar19 = iVar17;
  }
  else {
    iVar19 = *(int *)&object[1].te_g.g_pd;
    local_6c = *(int *)((long)&object[1].te_g.g_pd + 4);
    if (iVar19 == 0) {
      iVar19 = iVar17;
    }
    if (local_6c == 0) {
      local_6c = iVar19;
    }
    iVar16 = *(int *)&object[1].te_g.g_next;
    if (iVar19 <= iVar16) {
      iVar16 = iVar19;
    }
    downsample = *(int *)&object[2].te_g.g_pd;
    upsample = *(int *)&object[1].te_width;
    if (iVar17 <= downsample) {
      downsample = iVar17;
    }
    local_48 = iVar17 * upsample * iVar16;
    local_40 = (downsample * iVar19) / local_48;
    local_48 = local_48 / (downsample * iVar19);
    if (local_40 < 2) {
      local_40 = 1;
    }
    if (local_48 < 2) {
      local_48 = 1;
    }
    *(int *)((long)&object[1].te_binbuf + 4) = local_48;
    *(int *)&object[1].te_binbuf = local_40;
    *(uint *)((long)&object[1].te_g.g_next + 4) =
         local_40 - 1U & *(uint *)(pd_maininstance.pd_ugen + 0x130);
    if ((((p_Var2 == (_dspcontext *)0x0) || (iVar16 != 1)) || (upsample != 1)) ||
       ((iVar19 != iVar17 || (uVar10 = 0, downsample != 1)))) {
      uVar10 = 1;
    }
    uVar11 = (ulong)(uint)(int)(char)object[1].te_xpix;
    fVar24 = ((float)upsample * (float)iVar16 * local_60) / (float)downsample;
  }
  dc->dc_reblock = (char)uVar10;
  dc->dc_switched = (char)uVar11;
  dc->dc_srate = fVar24;
  dc->dc_vecsize = iVar19;
  dc->dc_calcsize = local_6c;
  pptVar15 = dc->dc_iosigs;
  iVar16 = (int)uVar11;
  local_68 = (int)uVar10;
  if (((pptVar15 != (t_signal **)0x0) && (iVar16 != 0 || local_68 != 0)) && (0 < dc->dc_noutlets)) {
    iVar1 = dc->dc_ninlets;
    lVar21 = 0;
    do {
      ptVar8 = pptVar15[iVar1 + lVar21];
      if ((ptVar8->s_isborrowed != 0) && (ptVar8->s_borrowedfrom == (_signal *)0x0)) {
        sig2 = signal_new(iVar17,local_60);
        signal_setborrowed(ptVar8,sig2);
        ptVar8 = pptVar15[iVar1 + lVar21];
        ptVar8->s_refcount = ptVar8->s_refcount + 1;
        if (*(int *)(pd_maininstance.pd_ugen + 0x134) != 0) {
          post("set %lx->%lx",ptVar8,ptVar8->s_borrowedfrom);
        }
      }
      lVar21 = lVar21 + 1;
    } while ((int)lVar21 < dc->dc_noutlets);
  }
  if (*(int *)(pd_maininstance.pd_ugen + 0x134) != 0) {
    post("reblock %d, switched %d",uVar10,uVar11);
  }
  for (p_Var7 = dc->dc_ugenlist; p_Var7 != (_ugenbox *)0x0; p_Var7 = p_Var7->u_next) {
    pptVar15 = dc->dc_iosigs;
    if (pptVar15 == (t_signal **)0x0) {
      parentsigs = (t_signal **)0x0;
    }
    else {
      parentsigs = pptVar15 + dc->dc_ninlets;
    }
    x = (_vinlet *)p_Var7->u_obj;
    p_Var3 = (x->x_obj).te_g.g_pd;
    if (p_Var3 == vinlet_class) {
      vinlet_dspprolog(x,pptVar15,iVar19,local_6c,*(int *)(pd_maininstance.pd_ugen + 0x130),local_40
                       ,local_48,downsample,upsample,local_68,iVar16);
    }
    else if (p_Var3 == voutlet_class) {
      voutlet_dspprolog((_voutlet *)x,parentsigs,iVar19,local_6c,
                        *(int *)(pd_maininstance.pd_ugen + 0x130),local_40,local_48,downsample,
                        upsample,local_68,iVar16);
    }
  }
  iVar1 = *(int *)(pd_maininstance.pd_ugen + 8);
  if ((object != (t_object *)0x0) && (iVar16 != 0 || local_68 != 0)) {
    dsp_add(block_prolog,1,object);
    *(int *)((long)&object[1].te_outlet + 4) = *(int *)(pd_maininstance.pd_ugen + 8) + -1;
  }
  for (p_Var7 = dc->dc_ugenlist; p_Var7 != (_ugenbox *)0x0; p_Var7 = p_Var7->u_next) {
    p_Var7->u_done = 0;
    iVar9 = p_Var7->u_nout;
    if (iVar9 != 0) {
      piVar14 = &p_Var7->u_out->o_nsent;
      do {
        *piVar14 = 0;
        piVar14 = piVar14 + 6;
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
    }
    iVar9 = p_Var7->u_nin;
    if (iVar9 != 0) {
      pptVar15 = &p_Var7->u_in->i_signal;
      do {
        *(int *)((long)pptVar15 + -4) = 0;
        *pptVar15 = (t_signal *)0x0;
        pptVar15 = pptVar15 + 2;
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
    }
  }
  for (p_Var7 = dc->dc_ugenlist; p_Var7 != (t_ugenbox *)0x0; p_Var7 = p_Var7->u_next) {
    if (p_Var7->u_done == 0) {
      iVar9 = p_Var7->u_nin;
      if (iVar9 != 0) {
        p_Var12 = p_Var7->u_in;
        do {
          if (p_Var12->i_nconnect != 0) goto LAB_0013039a;
          p_Var12 = p_Var12 + 1;
          iVar9 = iVar9 + -1;
        } while (iVar9 != 0);
      }
      ugen_doit(dc,p_Var7);
    }
LAB_0013039a:
  }
  p_Var7 = dc->dc_ugenlist;
  do {
    if (p_Var7 == (_ugenbox *)0x0) {
LAB_0013046b:
      if ((object != (t_object *)0x0) && (iVar16 != 0 || local_68 != 0)) {
        dsp_add(block_epilog,1,object);
      }
      iVar17 = *(int *)(pd_maininstance.pd_ugen + 8);
      for (p_Var7 = dc->dc_ugenlist; p_Var7 != (_ugenbox *)0x0; p_Var7 = p_Var7->u_next) {
        if ((((_voutlet *)p_Var7->u_obj)->x_obj).te_g.g_pd == voutlet_class) {
          if (dc->dc_iosigs == (t_signal **)0x0) {
            pptVar15 = (t_signal **)0x0;
          }
          else {
            pptVar15 = dc->dc_iosigs + dc->dc_ninlets;
          }
          voutlet_dspepilog((_voutlet *)p_Var7->u_obj,pptVar15,iVar19,local_6c,
                            *(int *)(pd_maininstance.pd_ugen + 0x130),local_40,local_48,downsample,
                            upsample,local_68,iVar16);
        }
      }
      if (object != (t_object *)0x0) {
        iVar19 = *(int *)(pd_maininstance.pd_ugen + 8);
        *(int *)&object[1].te_inlet = iVar17 - iVar1;
        *(int *)((long)&object[1].te_inlet + 4) = iVar19 - iVar17;
        *(char *)&object[1].te_ypix = (char)uVar10;
      }
      if (*(int *)(pd_maininstance.pd_ugen + 0x134) != 0) {
        if ((dc->dc_parentcontext == (_dspcontext *)0x0) &&
           (iVar17 = *(int *)(pd_maininstance.pd_ugen + 8), iVar17 != 0)) {
          lVar21 = *(long *)pd_maininstance.pd_ugen;
          lVar22 = 0;
          do {
            post("chain %lx",*(undefined8 *)(lVar21 + lVar22 * 8));
            lVar22 = lVar22 + 1;
          } while (iVar17 != (int)lVar22);
        }
        post("... ugen_done_graph done.");
      }
      while (p_Var7 = dc->dc_ugenlist, p_Var7 != (_ugenbox *)0x0) {
        iVar17 = p_Var7->u_nout;
        if (iVar17 != 0) {
          p_Var20 = p_Var7->u_out;
          do {
            ptVar23 = p_Var20->o_connections;
            while (ptVar23 != (t_sigoutconnect *)0x0) {
              p_Var4 = ptVar23->oc_next;
              freebytes(ptVar23,0x18);
              ptVar23 = p_Var4;
            }
            iVar17 = iVar17 + -1;
            p_Var20 = p_Var20 + 1;
          } while (iVar17 != 0);
        }
        freebytes(dc->dc_ugenlist->u_out,(long)dc->dc_ugenlist->u_nout * 0x18);
        freebytes(dc->dc_ugenlist->u_in,(long)dc->dc_ugenlist->u_nin << 4);
        p_Var7 = dc->dc_ugenlist;
        dc->dc_ugenlist = p_Var7->u_next;
        freebytes(p_Var7,0x38);
      }
      if (*(_dspcontext **)(pd_maininstance.pd_ugen + 0x138) == dc) {
        *(_dspcontext **)(pd_maininstance.pd_ugen + 0x138) = dc->dc_parentcontext;
      }
      else {
        bug("THIS->u_context");
      }
      freebytes(dc,0x30);
      return;
    }
    if (p_Var7->u_done == 0) {
      pd_error(p_Var7->u_obj,"DSP loop detected (some tilde objects not scheduled)");
      if (0 < dc->dc_noutlets) {
        iVar9 = dc->dc_ninlets;
        pptVar15 = dc->dc_iosigs;
        lVar21 = 0;
        do {
          if ((pptVar15[iVar9 + lVar21]->s_isborrowed != 0) &&
             (pptVar15[iVar9 + lVar21]->s_borrowedfrom == (_signal *)0x0)) {
            ptVar8 = signal_new(iVar17,local_60);
            signal_setborrowed(pptVar15[iVar9 + lVar21],ptVar8);
            pptVar15[iVar9 + lVar21]->s_refcount = pptVar15[iVar9 + lVar21]->s_refcount + 1;
            dsp_add_zero(ptVar8->s_vec,ptVar8->s_n);
            if (*(int *)(pd_maininstance.pd_ugen + 0x134) != 0) {
              post("oops, belatedly set %lx->%lx",pptVar15[iVar9 + lVar21],
                   pptVar15[iVar9 + lVar21]->s_borrowedfrom);
            }
          }
          lVar21 = lVar21 + 1;
        } while ((int)lVar21 < dc->dc_noutlets);
      }
      goto LAB_0013046b;
    }
    p_Var7 = p_Var7->u_next;
  } while( true );
}

Assistant:

void ugen_done_graph(t_dspcontext *dc)
{
    t_ugenbox *u;
    t_sigoutlet *uout;
    t_siginlet *uin;
    t_sigoutconnect *oc, *oc2;
    int i, n;
    t_block *blk;
    t_dspcontext *parent_context = dc->dc_parentcontext;
    t_float parent_srate;
    int parent_vecsize;
    int period, frequency, phase, vecsize, calcsize;
    t_float srate;
    int chainblockbegin;    /* DSP chain onset before block prolog code */
    int chainblockend;      /* and after block epilog code */
    int chainafterall;      /* and after signal outlet epilog */
    int reblock = 0, switched;
    int downsample = 1, upsample = 1;
    /* debugging printout */

    if (THIS->u_loud)
    {
        post("ugen_done_graph...");
        for (u = dc->dc_ugenlist; u; u = u->u_next)
        {
            post("ugen: %s", class_getname(u->u_obj->ob_pd));
            for (uout = u->u_out, i = 0; i < u->u_nout; uout++, i++)
                for (oc = uout->o_connections; oc; oc = oc->oc_next)
            {
                post("... out %d to %s, index %d, inlet %d", i,
                    class_getname(oc->oc_who->u_obj->ob_pd),
                        ugen_index(dc, oc->oc_who), oc->oc_inno);
            }
        }
    }

        /* search for an object of class "block~" */
    for (u = dc->dc_ugenlist, blk = 0; u; u = u->u_next)
    {
        t_pd *zz = &u->u_obj->ob_pd;
        if (pd_class(zz) == block_class)
        {
            if (blk)
                pd_error(blk, "conflicting block~ and/or switch~ objects in same window");
            else blk = (t_block *)zz;
        }
    }

        /* figure out block size, calling frequency, sample rate */
    if (parent_context)
    {
        parent_srate = parent_context->dc_srate;
        parent_vecsize = parent_context->dc_vecsize;
    }
    else
    {
        parent_srate = sys_getsr();
        parent_vecsize = sys_getblksize();
    }
    if (blk)
    {
        int realoverlap;
        vecsize = blk->x_vecsize;
        if (vecsize == 0)
            vecsize = parent_vecsize;
        calcsize = blk->x_calcsize;
        if (calcsize == 0)
            calcsize = vecsize;
        realoverlap = blk->x_overlap;
        if (realoverlap > vecsize) realoverlap = vecsize;
        downsample = blk->x_downsample;
        upsample   = blk->x_upsample;
        if (downsample > parent_vecsize)
            downsample = parent_vecsize;
        period = (vecsize * downsample)/
            (parent_vecsize * realoverlap * upsample);
        frequency = (parent_vecsize * realoverlap * upsample)/
            (vecsize * downsample);
        phase = blk->x_phase;
        srate = parent_srate * realoverlap * upsample / downsample;
        if (period < 1) period = 1;
        if (frequency < 1) frequency = 1;
        blk->x_frequency = frequency;
        blk->x_period = period;
        blk->x_phase = THIS->u_phase & (period - 1);
        if (! parent_context || (realoverlap != 1) ||
            (vecsize != parent_vecsize) ||
                (downsample != 1) || (upsample != 1))
                    reblock = 1;
        switched = blk->x_switched;
    }
    else
    {
        srate = parent_srate;
        vecsize = parent_vecsize;
        calcsize = (parent_context ? parent_context->dc_calcsize : vecsize);
        downsample = upsample = 1;
        period = frequency = 1;
        phase = 0;
        if (!parent_context) reblock = 1;
        switched = 0;
    }
    dc->dc_reblock = reblock;
    dc->dc_switched = switched;
    dc->dc_srate = srate;
    dc->dc_vecsize = vecsize;
    dc->dc_calcsize = calcsize;

        /* if we're reblocking or switched, we now have to create output
        signals to fill in for the "borrowed" ones we have now.  This
        is also possibly true even if we're not blocked/switched, in
        the case that there was a signal loop.  But we don't know this
        yet.  */

    if (dc->dc_iosigs && (switched || reblock))
    {
        t_signal **sigp;
        for (i = 0, sigp = dc->dc_iosigs + dc->dc_ninlets; i < dc->dc_noutlets;
            i++, sigp++)
        {
            if ((*sigp)->s_isborrowed && !(*sigp)->s_borrowedfrom)
            {
                signal_setborrowed(*sigp,
                    signal_new(parent_vecsize, parent_srate));
                (*sigp)->s_refcount++;

                if (THIS->u_loud) post("set %lx->%lx", *sigp,
                    (*sigp)->s_borrowedfrom);
            }
        }
    }

    if (THIS->u_loud)
        post("reblock %d, switched %d", reblock, switched);

        /* schedule prologs for inlets and outlets.  If the "reblock" flag
        is set, an inlet will put code on the DSP chain to copy its input
        into an internal buffer here, before any unit generators' DSP code
        gets scheduled.  If we don't "reblock", inlets will need to get
        pointers to their corresponding inlets/outlets on the box we're inside,
        if any.  Outlets will also need pointers, unless we're switched, in
        which case outlet epilog code will kick in. */

    for (u = dc->dc_ugenlist; u; u = u->u_next)
    {
        t_pd *zz = &u->u_obj->ob_pd;
        t_signal **outsigs = dc->dc_iosigs;
        if (outsigs) outsigs += dc->dc_ninlets;

        if (pd_class(zz) == vinlet_class)
            vinlet_dspprolog((struct _vinlet *)zz,
                dc->dc_iosigs, vecsize, calcsize, THIS->u_phase, period, frequency,
                    downsample, upsample, reblock, switched);
        else if (pd_class(zz) == voutlet_class)
            voutlet_dspprolog((struct _voutlet *)zz,
                outsigs, vecsize, calcsize, THIS->u_phase, period, frequency,
                    downsample, upsample, reblock, switched);
    }
    chainblockbegin = THIS->u_dspchainsize;

    if (blk && (reblock || switched))   /* add the block DSP prolog */
    {
        dsp_add(block_prolog, 1, blk);
        blk->x_chainonset = THIS->u_dspchainsize - 1;
    }
        /* Initialize for sorting */
    for (u = dc->dc_ugenlist; u; u = u->u_next)
    {
        u->u_done = 0;
        for (uout = u->u_out, i = u->u_nout; i--; uout++)
            uout->o_nsent = 0;
        for (uin = u->u_in, i = u->u_nin; i--; uin++)
            uin->i_ngot = 0, uin->i_signal = 0;
   }

        /* Do the sort */

    for (u = dc->dc_ugenlist; u; u = u->u_next)
    {
            /* check that we have no connected signal inlets */
        if (u->u_done) continue;
        for (uin = u->u_in, i = u->u_nin; i--; uin++)
            if (uin->i_nconnect) goto next;

        ugen_doit(dc, u);
    next: ;
    }

        /* check for a DSP loop, which is evidenced here by the presence
        of ugens not yet scheduled. */

    for (u = dc->dc_ugenlist; u; u = u->u_next)
        if (!u->u_done)
    {
        t_signal **sigp;
        pd_error(u->u_obj,
            "DSP loop detected (some tilde objects not scheduled)");
                /* this might imply that we have unfilled "borrowed" outputs
                which we'd better fill in now. */
        for (i = 0, sigp = dc->dc_iosigs + dc->dc_ninlets; i < dc->dc_noutlets;
            i++, sigp++)
        {
            if ((*sigp)->s_isborrowed && !(*sigp)->s_borrowedfrom)
            {
                t_signal *s3 = signal_new(parent_vecsize, parent_srate);
                signal_setborrowed(*sigp, s3);
                (*sigp)->s_refcount++;
                dsp_add_zero(s3->s_vec, s3->s_n);
                if (THIS->u_loud)
                    post("oops, belatedly set %lx->%lx", *sigp,
                        (*sigp)->s_borrowedfrom);
            }
        }
        break;   /* don't need to keep looking. */
    }

    if (blk && (reblock || switched))    /* add block DSP epilog */
        dsp_add(block_epilog, 1, blk);
    chainblockend = THIS->u_dspchainsize;

        /* add epilogs for outlets.  */

    for (u = dc->dc_ugenlist; u; u = u->u_next)
    {
        t_pd *zz = &u->u_obj->ob_pd;
        if (pd_class(zz) == voutlet_class)
        {
            t_signal **iosigs = dc->dc_iosigs;
            if (iosigs) iosigs += dc->dc_ninlets;
            voutlet_dspepilog((struct _voutlet *)zz,
                iosigs, vecsize, calcsize, THIS->u_phase, period, frequency,
                    downsample, upsample, reblock, switched);
        }
    }

    chainafterall = THIS->u_dspchainsize;
    if (blk)
    {
        blk->x_blocklength = chainblockend - chainblockbegin;
        blk->x_epiloglength = chainafterall - chainblockend;
        blk->x_reblock = reblock;
    }

    if (THIS->u_loud)
    {
        t_int *ip;
        if (!dc->dc_parentcontext)
            for (i = THIS->u_dspchainsize, ip = THIS->u_dspchain;
                i--; ip++)
                    post("chain %lx", *ip);
        post("... ugen_done_graph done.");
    }
        /* now delete everything. */
    while (dc->dc_ugenlist)
    {
        for (uout = dc->dc_ugenlist->u_out, n = dc->dc_ugenlist->u_nout;
            n--; uout++)
        {
            oc = uout->o_connections;
            while (oc)
            {
                oc2 = oc->oc_next;
                freebytes(oc, sizeof *oc);
                oc = oc2;
            }
        }
        freebytes(dc->dc_ugenlist->u_out, dc->dc_ugenlist->u_nout *
            sizeof (*dc->dc_ugenlist->u_out));
        freebytes(dc->dc_ugenlist->u_in, dc->dc_ugenlist->u_nin *
            sizeof(*dc->dc_ugenlist->u_in));
        u = dc->dc_ugenlist;
        dc->dc_ugenlist = u->u_next;
        freebytes(u, sizeof *u);
    }
    if (THIS->u_context == dc)
        THIS->u_context = dc->dc_parentcontext;
    else bug("THIS->u_context");
    freebytes(dc, sizeof(*dc));

}